

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O2

queue * createQueue(size_t max_elements)

{
  queue *pqVar1;
  chunk **ppcVar2;
  size_t s;
  size_t sVar3;
  
  pqVar1 = (queue *)calloc(1,0x28);
  pqVar1->capacity = max_elements;
  pqVar1->head = 1;
  ppcVar2 = (chunk **)calloc(max_elements,8);
  pqVar1->elements = ppcVar2;
  for (sVar3 = 0; max_elements != sVar3; sVar3 = sVar3 + 1) {
    ppcVar2[sVar3] = (chunk *)0x0;
  }
  return pqVar1;
}

Assistant:

queue* createQueue(const size_t max_elements)
{
    queue* q = NULL;
    q = calloc(1, sizeof(queue));
    q->capacity = max_elements;
    q->size = 0;
    q->head = 1;
    q->tail = 0;
    q->elements = calloc(max_elements, sizeof(chunk*));

    for (size_t s=0; s<max_elements; ++s)
    {
        q->elements[s] = NULL;
    }

    return q;
}